

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_version.c
# Opt level: O3

void test_option_version(void)

{
  char cVar1;
  byte bVar2;
  wchar_t wVar3;
  char *_v1;
  ushort **ppuVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  size_t l;
  char *ld;
  size_t s;
  
  wVar3 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  if (wVar3 == L'\0') {
    wVar3 = L'\x01';
  }
  else {
    wVar3 = systemf("%s -W version >version.stdout 2>version.stderr",testprog);
    wVar3 = (wchar_t)(wVar3 == L'\0');
  }
  failure("Unable to run either %s --version or %s -W version",testprog);
  wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                           ,L'i',wVar3,"r == 0",(void *)0x0);
  if (wVar3 == L'\0') {
    return;
  }
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
             ,L'm',"version.stderr");
  _v1 = slurpfile(&s,"version.stdout");
  failure("version message too short:",_v1);
  wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                           ,L'\'',(uint)(6 < s),"s > 6",(void *)0x0);
  if (wVar3 == L'\0') goto LAB_00110d95;
  failure("Version message should begin with \'bsdcpio\': %s",_v1);
  wVar3 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                              ,L'*',_v1,"q","bsdcpio ","\"bsdcpio \"",8,"8",(void *)0x0);
  if (wVar3 == L'\0') goto LAB_00110d95;
  pcVar11 = _v1 + 8;
  uVar9 = s - 8;
  if (uVar9 == 0) {
    uVar9 = 0;
  }
  else {
    do {
      if (*pcVar11 != '.' && 9 < (byte)(*pcVar11 - 0x30U)) goto LAB_00110ad4;
      pcVar11 = pcVar11 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    uVar9 = 0;
    pcVar11 = _v1 + s;
  }
LAB_00110ad4:
  failure("Version: %s",_v1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                   ,L'5',(uint)(1 < uVar9),"s > 1",(void *)0x0);
  uVar7 = (ulong)((byte)(*pcVar11 + 0x9fU) < 4);
  failure("Version: %s",_v1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                   ,L':',(uint)(pcVar11[uVar7] == ' '),"*q == \' \'",(void *)0x0);
  failure("Version: %s",_v1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                      ,L'>',pcVar11 + uVar7 + 1,"q","-- ","\"-- \"",3,"3",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                   ,L'A',(uint)(uVar9 - 0x10 < 0xfffffffffffffff4),"s > 11",(void *)0x0);
  failure("Version: %s",_v1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                      ,L'C',pcVar11 + uVar7 + 4,"q","libarchive ","\"libarchive \"",0xb,"11",
                      (void *)0x0);
  pcVar6 = pcVar11 + uVar7 + 0xf;
  lVar5 = uVar9 - 0xf;
  pcVar12 = pcVar6;
  if (lVar5 != 0) {
    pcVar12 = pcVar11 + uVar9 + uVar7;
    lVar10 = 0;
    do {
      cVar1 = pcVar6[lVar10];
      if (cVar1 != '.' && 9 < (byte)(cVar1 - 0x30U)) {
        uVar9 = (ulong)((byte)(cVar1 + 0x9fU) < 4);
        pcVar12 = pcVar6 + uVar9 + lVar5;
        lVar8 = 0;
        goto LAB_00110c9c;
      }
      lVar10 = lVar10 + 1;
    } while (lVar5 != lVar10);
  }
  pcVar12 = pcVar12 + ((byte)(*pcVar12 + 0x9fU) < 4);
  wVar3 = L'\0';
  goto LAB_00110ce7;
  while (lVar8 = lVar8 + 1, lVar5 - lVar10 != lVar8) {
LAB_00110c9c:
    bVar2 = pcVar6[lVar10 + lVar8 + uVar9];
    if (((0x2f < (ulong)bVar2) || ((0xc00100000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(char)bVar2] & 8) == 0)) {
      pcVar12 = pcVar6 + lVar10 + lVar8 + uVar9;
      wVar3 = L'\x01';
      goto LAB_00110ce7;
    }
  }
  wVar3 = L'\0';
LAB_00110ce7:
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                   ,L'S',wVar3,"s >= 1",(void *)0x0);
  failure("Version: %s",_v1);
  if (*pcVar12 == '\r') {
    if (pcVar12[1] == '\0') goto LAB_00110d95;
    pcVar11 = "\r\n";
    pcVar6 = "\"\\x0d\\x0a\"";
    wVar3 = L'W';
    ld = "2";
    l = 2;
  }
  else {
    pcVar11 = "\n";
    pcVar6 = "\"\\x0a\"";
    wVar3 = L'Y';
    ld = "1";
    l = 1;
  }
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                      ,wVar3,pcVar12,"q",pcVar11,pcVar6,l,ld,(void *)0x0);
LAB_00110d95:
  free(_v1);
  return;
}

Assistant:

DEFINE_TEST(test_option_version)
{
	int r;
	char *p;
	size_t s;

	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	if (r != 0)
		r = systemf("%s -W version >version.stdout 2>version.stderr",
		    testprog);
	failure("Unable to run either %s --version or %s -W version",
	    testprog, testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stderr. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	p = slurpfile(&s, "version.stdout");
	verify(p, s);
	free(p);
}